

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5TokenizerInit(fts5_api *pApi)

{
  int local_80;
  int local_7c;
  int i;
  int rc;
  BuiltinTokenizer aBuiltin [3];
  fts5_api *pApi_local;
  
  memcpy(&i,&PTR_anon_var_dwarf_1b0a3_0025a4e0,0x60);
  local_7c = 0;
  for (local_80 = 0; local_7c == 0 && local_80 < 3; local_80 = local_80 + 1) {
    local_7c = (*pApi->xCreateTokenizer)
                         (pApi,*(char **)(&i + (long)local_80 * 8),pApi,
                          (fts5_tokenizer *)(aBuiltin + local_80),(_func_void_void_ptr *)0x0);
  }
  return local_7c;
}

Assistant:

static int sqlite3Fts5TokenizerInit(fts5_api *pApi){
  struct BuiltinTokenizer {
    const char *zName;
    fts5_tokenizer x;
  } aBuiltin[] = {
    { "unicode61", {fts5UnicodeCreate, fts5UnicodeDelete, fts5UnicodeTokenize}},
    { "ascii",     {fts5AsciiCreate, fts5AsciiDelete, fts5AsciiTokenize }},
    { "porter",    {fts5PorterCreate, fts5PorterDelete, fts5PorterTokenize }},
  };
  
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* To iterate through builtin functions */

  for(i=0; rc==SQLITE_OK && i<ArraySize(aBuiltin); i++){
    rc = pApi->xCreateTokenizer(pApi,
        aBuiltin[i].zName,
        (void*)pApi,
        &aBuiltin[i].x,
        0
    );
  }

  return rc;
}